

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void search::checkup(SearchInfo *info)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int64_t iVar4;
  string input;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  if (-1 < info->stopTime) {
    iVar4 = utils::getTime();
    if (info->stopTime < iVar4) {
      info->stopped = true;
    }
  }
  bVar1 = utils::inputWaiting();
  if (bVar1) {
    info->stopped = true;
    local_28 = 0;
    local_20 = 0;
    local_30 = &local_20;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_30,cVar2);
    iVar3 = std::__cxx11::string::compare((char *)&local_30);
    if (iVar3 == 0) {
      info->quit = true;
    }
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return;
}

Assistant:

void search::checkup(SearchInfo& info)
{
    if (info.getStopTime() > -1 && utils::getTime() > info.getStopTime()) {
        info.setStopped(true);
    }
    if (utils::inputWaiting()) {
        info.setStopped(true);
        std::string input;
        std::getline(std::cin, input);
        if (input == "quit") {
            info.setQuit(true);
        }
    }
}